

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# osdtext.cpp
# Opt level: O0

int __thiscall
CS248::OSDText::add_line(OSDText *this,float x,float y,string *text,size_t size,Color color)

{
  int iVar1;
  size_type in_RDX;
  OSDLine *in_RSI;
  byte *in_RDI;
  undefined8 in_XMM2_Qa;
  size_t in_XMM3_Qa;
  OSDLine new_line;
  value_type *__x;
  value_type local_68;
  undefined8 local_10;
  size_t local_8;
  
  local_68.text.field_2._M_allocated_capacity = 0;
  local_68.text.field_2._8_8_ = 0;
  local_68.text._M_dataplus = (_Alloc_hider)0x0;
  local_68.text._1_7_ = 0;
  local_68.text._M_string_length = 0;
  local_68.id = 0;
  local_68.x = 0.0;
  local_68.y = 0.0;
  local_68._12_4_ = 0;
  local_68.size = 0;
  __x = &local_68;
  local_68.color._0_8_ = in_RDX;
  local_10 = in_XMM2_Qa;
  local_8 = in_XMM3_Qa;
  OSDLine::OSDLine(in_RSI);
  std::__cxx11::string::operator=((string *)__x,(string *)in_RSI);
  local_68.text.field_2._M_allocated_capacity._0_4_ = local_68.color.r;
  local_68.text.field_2._M_allocated_capacity._4_4_ = local_68.color.g;
  local_68.text.field_2._8_8_ = local_10;
  local_68.size = local_8;
  if ((*in_RDI & 1) != 0) {
    local_68.text.field_2._M_allocated_capacity = local_68.color._0_8_ << 1;
  }
  iVar1 = *(int *)(in_RDI + 0xc);
  *(int *)(in_RDI + 0xc) = *(int *)(in_RDI + 0xc) + 1;
  std::vector<CS248::OSDLine,_std::allocator<CS248::OSDLine>_>::push_back
            ((vector<CS248::OSDLine,_std::allocator<CS248::OSDLine>_> *)in_RSI,__x);
  OSDLine::~OSDLine((OSDLine *)0x205132);
  return iVar1;
}

Assistant:

int OSDText::add_line(float x, float y, string text,
                      size_t size, Color color) {
  // create new line
  OSDLine new_line = OSDLine();
  new_line.x = x;
  new_line.y = y;
  new_line.text = text;
  new_line.size = size;
  new_line.color = color;

  // handle HDPI display
  if (use_hdpi) new_line.size *= 2;

  // update id
  new_line.id = next_id;
  next_id++;

  // add line
  lines.push_back(new_line);
  return new_line.id;
}